

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O0

base_learner * topk_setup(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<unsigned_int> *this;
  pointer ptVar2;
  base_learner *this_00;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *this_01;
  vw *in_RSI;
  long *in_RDI;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  option_group_definition new_options;
  free_ptr<topk> data;
  string *in_stack_fffffffffffffdd8;
  vw *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  single_learner *in_stack_fffffffffffffdf0;
  typed_option<unsigned_int> *op;
  allocator local_1a9;
  string local_1a8 [39];
  undefined1 local_181 [40];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_int> local_138;
  allocator local_81;
  string local_80 [32];
  learner<char,_char> *in_stack_ffffffffffffffa0;
  vw *local_8;
  
  scoped_calloc_or_throw<topk>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Top K",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"top",&local_159);
  std::unique_ptr<topk,_void_(*)(void_*)>::operator->
            ((unique_ptr<topk,_void_(*)(void_*)> *)0x2a546c);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffde8,(uint *)in_stack_fffffffffffffde0)
  ;
  this = VW::config::typed_option<unsigned_int>::keep(&local_138,true);
  op = (typed_option<unsigned_int> *)local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_181 + 1),"top k recommendation",(allocator *)op);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)this,op);
  std::__cxx11::string::~string((string *)(local_181 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_181);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*in_RDI)(in_RDI,&stack0xffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"top",&local_1a9);
  bVar1 = (**(code **)(*in_RDI + 8))(in_RDI,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    ptVar2 = std::unique_ptr<topk,_void_(*)(void_*)>::operator->
                       ((unique_ptr<topk,_void_(*)(void_*)> *)0x2a5765);
    ptVar2->all = in_RSI;
    this_00 = setup_base((options_i *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    in_stack_fffffffffffffdf0 = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffffa0);
    this_01 = LEARNER::
              init_learner<topk,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,example>>
                        ((free_ptr<topk> *)in_stack_fffffffffffffdf0,
                         (learner<char,_example> *)in_stack_fffffffffffffde8,
                         (_func_void_topk_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                          *)in_stack_fffffffffffffde0,
                         (_func_void_topk_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                          *)in_stack_fffffffffffffdd8);
    LEARNER::learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish_example
              (this_01,finish_example);
    LEARNER::learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
              ((learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *)this_00,
               (_func_void_topk_ptr *)in_RSI);
    in_stack_fffffffffffffde0 =
         (vw *)LEARNER::make_base<topk,std::vector<example*,std::allocator<example*>>>(this_01);
    local_8 = in_stack_fffffffffffffde0;
  }
  else {
    local_8 = (vw *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffde0);
  std::unique_ptr<topk,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<topk,_void_(*)(void_*)> *)in_stack_fffffffffffffdf0);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* topk_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<topk>();

  option_group_definition new_options("Top K");
  new_options.add(make_option("top", data->K).keep().help("top k recommendation"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("top"))
    return nullptr;

  data->all = &all;

  LEARNER::learner<topk, multi_ex>& l =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}